

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

Expr * nivalis::anon_unknown_3::combine_expr(uint32_t opcode,Expr *a,Expr *b)

{
  __normal_iterator<nivalis::Expr::ASTNode_*,_std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>
  __result;
  reference pvVar1;
  __normal_iterator<nivalis::Expr::ASTNode_*,_std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>
  __n;
  iterator __first;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *in_RCX;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *in_RDX;
  uint32_t in_ESI;
  Expr *in_RDI;
  Expr *new_expr;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *in_stack_ffffffffffffff38
  ;
  difference_type in_stack_ffffffffffffff40;
  Expr *this;
  __normal_iterator<const_nivalis::Expr::ASTNode_*,_std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>
  in_stack_ffffffffffffff60;
  __normal_iterator<const_nivalis::Expr::ASTNode_*,_std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>
  in_stack_ffffffffffffff68;
  ASTNode local_48 [2];
  undefined1 local_21;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *local_20;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *local_18;
  uint32_t local_c;
  
  local_21 = 0;
  this = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  Expr::Expr(in_RDI);
  __result._M_current =
       (ASTNode *)
       std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::size(local_18);
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::size(local_20);
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::resize
            ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
             in_stack_ffffffffffffff60._M_current,(size_type)__result._M_current);
  Expr::ASTNode::ASTNode(local_48,local_c,0xffffffffffffffff);
  pvVar1 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::operator[]
                     (&this->ast,0);
  pvVar1->opcode = local_48[0].opcode;
  *(undefined4 *)&pvVar1->field_0x4 = local_48[0]._4_4_;
  pvVar1->field_1 = local_48[0].field_1;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::begin
            (in_stack_ffffffffffffff38);
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::end
            (in_stack_ffffffffffffff38);
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::begin
            (in_stack_ffffffffffffff38);
  __gnu_cxx::
  __normal_iterator<nivalis::Expr::ASTNode_*,_std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>
  ::operator+((__normal_iterator<nivalis::Expr::ASTNode_*,_std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>
               *)in_RDI,in_stack_ffffffffffffff40);
  __n = std::
        copy<__gnu_cxx::__normal_iterator<nivalis::Expr::ASTNode_const*,std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>,__gnu_cxx::__normal_iterator<nivalis::Expr::ASTNode*,std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>>
                  (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,__result);
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::begin
            (in_stack_ffffffffffffff38);
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::end
            (in_stack_ffffffffffffff38);
  __first = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::begin
                      (in_stack_ffffffffffffff38);
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::size(local_18);
  __gnu_cxx::
  __normal_iterator<nivalis::Expr::ASTNode_*,_std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>
  ::operator+((__normal_iterator<nivalis::Expr::ASTNode_*,_std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>
               *)in_RDI,(difference_type)__n._M_current);
  __gnu_cxx::
  __normal_iterator<nivalis::Expr::ASTNode_*,_std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>
  ::operator+((__normal_iterator<nivalis::Expr::ASTNode_*,_std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>
               *)in_RDI,(difference_type)__n._M_current);
  std::
  copy<__gnu_cxx::__normal_iterator<nivalis::Expr::ASTNode_const*,std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>,__gnu_cxx::__normal_iterator<nivalis::Expr::ASTNode*,std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>>
            ((__normal_iterator<const_nivalis::Expr::ASTNode_*,_std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>
              )__first._M_current,in_stack_ffffffffffffff60,__result);
  return in_RDI;
}

Assistant:

Expr combine_expr(uint32_t opcode, const Expr& a, const Expr& b) {
    Expr new_expr;
    new_expr.ast.resize(a.ast.size() + b.ast.size() + 1);
    new_expr.ast[0] = opcode;
    std::copy(a.ast.begin(), a.ast.end(), new_expr.ast.begin() + 1);
    std::copy(b.ast.begin(), b.ast.end(), new_expr.ast.begin() + a.ast.size() + 1);
    return new_expr;
}